

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall bloaty::RangeMapTest_Translation_Test::TestBody(RangeMapTest_Translation_Test *this)

{
  RangeMap *this_00;
  RangeMap *this_01;
  RangeMap *other;
  bool bVar1;
  char *pcVar2;
  long lVar3;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  initializer_list<bloaty::RangeMapTest::Entry> __l_00;
  initializer_list<bloaty::RangeMapTest::Entry> __l_01;
  initializer_list<bloaty::RangeMapTest::Entry> __l_02;
  initializer_list<bloaty::RangeMapTest::Entry> __l_03;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  allocator_type local_b1;
  AssertionResult gtest_ar_;
  undefined1 local_98 [24];
  string local_80 [32];
  undefined8 local_60;
  undefined8 local_58;
  uint64_t local_50;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"foo",(allocator<char> *)&gtest_ar_);
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddDualRange(this_00,0x14,5,0x78,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
  local_98._0_8_ = (char *)0x14;
  local_98._8_8_ = 0x19;
  local_98._16_8_ = 0x78;
  std::__cxx11::string::string<std::allocator<char>>(local_80,"foo",(allocator<char> *)&local_c8);
  __l._M_len = 1;
  __l._M_array = (iterator)local_98;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             &gtest_ar_,__l,(allocator_type *)&local_c0);
  RangeMapTest::AssertMainMapEquals
            (&this->super_RangeMapTest,
             (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             &gtest_ar_);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
             &gtest_ar_);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"translate me",(allocator<char> *)&local_c8);
  this_01 = &(this->super_RangeMapTest).map2_;
  other = &(this->super_RangeMapTest).map3_;
  pcVar2 = (char *)0x0;
  gtest_ar_.success_ =
       RangeMap::AddRangeWithTranslation(this_01,0x14,5,(string *)local_98,this_00,false,other);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&gtest_ar_,
               (AssertionResult *)
               "map2_.AddRangeWithTranslation(20, 5, \"translate me\", map_, false, &map3_)","false"
               ,"true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
               ,0x13d,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    RangeMapTest::CheckConsistency(&this->super_RangeMapTest);
    local_98._0_8_ = (pointer)0x14;
    local_98._8_8_ = 0x19;
    local_98._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"translate me",(allocator<char> *)&local_c8);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_98;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_,__l_00,(allocator_type *)&local_c0);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,this_01,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    std::__cxx11::string::~string(local_80);
    local_98._0_8_ = (char *)0x78;
    local_98._8_8_ = 0x7d;
    local_98._16_8_ = (this->super_RangeMapTest).kNoTranslation;
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"translate me",(allocator<char> *)&local_c8);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_98;
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_,__l_01,(allocator_type *)&local_c0);
    RangeMapTest::AssertMapEquals
              (&this->super_RangeMapTest,other,
               (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
              ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
               &gtest_ar_);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"bar",(allocator<char> *)&gtest_ar_);
    RangeMap::AddDualRange(this_00,1000,0x1e,0x44c,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"translate me2",(allocator<char> *)&local_c8);
    pcVar2 = (char *)0x0;
    gtest_ar_.success_ =
         RangeMap::AddRangeWithTranslation(this_01,1000,5,(string *)local_98,this_00,false,other);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::__cxx11::string::~string((string *)local_98);
    if (gtest_ar_.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      local_98._0_8_ = (pointer)0x14;
      local_98._8_8_ = 0x19;
      local_98._16_8_ = (this->super_RangeMapTest).kNoTranslation;
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"translate me",(allocator<char> *)&local_c8);
      local_60 = 1000;
      local_58 = 0x3ed;
      local_50 = (this->super_RangeMapTest).kNoTranslation;
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"translate me2",(allocator<char> *)&local_c0);
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)local_98;
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
                ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)&gtest_ar_,__l_02,&local_b1);
      RangeMapTest::AssertMapEquals
                (&this->super_RangeMapTest,this_01,
                 (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)&gtest_ar_);
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::
      ~vector((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
              &gtest_ar_);
      lVar3 = 0x50;
      do {
        std::__cxx11::string::~string((string *)(local_98 + lVar3));
        lVar3 = lVar3 + -0x38;
      } while (lVar3 != -0x20);
      local_98._0_8_ = (char *)0x78;
      local_98._8_8_ = 0x7d;
      local_98._16_8_ = (this->super_RangeMapTest).kNoTranslation;
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"translate me",(allocator<char> *)&local_c8);
      local_60 = 0x44c;
      local_58 = 0x451;
      local_50 = (this->super_RangeMapTest).kNoTranslation;
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"translate me2",(allocator<char> *)&local_c0);
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)local_98;
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
                ((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)&gtest_ar_,__l_03,&local_b1);
      RangeMapTest::AssertMapEquals
                (&this->super_RangeMapTest,other,
                 (vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>
                  *)&gtest_ar_);
      std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::
      ~vector((vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> *)
              &gtest_ar_);
      lVar3 = 0x50;
      do {
        std::__cxx11::string::~string((string *)(local_98 + lVar3));
        lVar3 = lVar3 + -0x38;
      } while (lVar3 != -0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,"translate me",(allocator<char> *)&local_c8);
      pcVar2 = (char *)0x0;
      bVar1 = RangeMap::AddRangeWithTranslation
                        (this_01,0xf,8,(string *)local_98,this_00,false,other);
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)local_98);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "map2_.AddRangeWithTranslation(15, 8, \"translate me\", map_, false, &map3_)",
                   "true","false",pcVar2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                   ,0x155,(char *)local_98._0_8_);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,"translate me",(allocator<char> *)&local_c8);
        pcVar2 = (char *)0x0;
        bVar1 = RangeMap::AddRangeWithTranslation
                          (this_01,0x16,0xf,(string *)local_98,this_00,false,other);
        gtest_ar_.success_ = !bVar1;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::~string((string *)local_98);
        if (gtest_ar_.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,"translate me",(allocator<char> *)&local_c8);
          pcVar2 = (char *)0x0;
          bVar1 = RangeMap::AddRangeWithTranslation
                            (this_01,0x14,1000,(string *)local_98,this_00,false,other);
          gtest_ar_.success_ = !bVar1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::__cxx11::string::~string((string *)local_98);
          if (bVar1) {
            testing::Message::Message((Message *)&local_c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "map2_.AddRangeWithTranslation(20, 1000, \"translate me\", map_, false, &map3_)"
                       ,"true","false",pcVar2);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                       ,0x15d,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            std::__cxx11::string::~string((string *)local_98);
            if (local_c8._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_c8._M_head_impl + 8))();
            }
          }
          goto LAB_0017292d;
        }
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "map2_.AddRangeWithTranslation(22, 15, \"translate me\", map_, false, &map3_)",
                   "true","false",pcVar2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
                   ,0x159,(char *)local_98._0_8_);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
      }
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)local_98);
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      goto LAB_0017292d;
    }
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&gtest_ar_,
               (AssertionResult *)
               "map2_.AddRangeWithTranslation(1000, 5, \"translate me2\", map_, false, &map3_)",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/range_map_test.cc"
               ,0x149,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  std::__cxx11::string::~string((string *)local_98);
  if (local_c8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_c8._M_head_impl + 8))();
  }
LAB_0017292d:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation) {
  map_.AddDualRange(20, 5, 120, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {20, 25, 120, "foo"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 5, "translate me", map_, false,
                                            &map3_));

  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"}
  });

  map_.AddDualRange(1000, 30, 1100, "bar");
  ASSERT_TRUE(map2_.AddRangeWithTranslation(1000, 5, "translate me2", map_,
                                            false, &map3_));
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {1000, 1005, kNoTranslation, "translate me2"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {1100, 1105, kNoTranslation, "translate me2"}
  });

  // Starts before base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(15, 8, "translate me", map_, false,
                                             &map3_));

  // Extends past base map.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(22, 15, "translate me", map_,
                                             false, &map3_));

  // Starts and ends in base map, but skips range in the middle.
  ASSERT_FALSE(map2_.AddRangeWithTranslation(20, 1000, "translate me", map_,
                                             false, &map3_));
}